

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.h
# Opt level: O0

bool __thiscall DyndepParser::ParseTest(DyndepParser *this,string *input,string *err)

{
  int iVar1;
  allocator<char> local_41;
  string local_40 [32];
  string *local_20;
  string *err_local;
  string *input_local;
  DyndepParser *this_local;
  
  local_20 = err;
  err_local = input;
  input_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"input",&local_41);
  iVar1 = (**(this->super_Parser)._vptr_Parser)(this,local_40,err_local,local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool ParseTest(const std::string& input, std::string* err) {
    return Parse("input", input, err);
  }